

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

int Cudd_ApaCompare(int digitsFirst,DdApaNumber first,int digitsSecond,DdApaNumber second)

{
  int local_34;
  int local_30;
  int secondNZ;
  int firstNZ;
  int i;
  DdApaNumber second_local;
  int digitsSecond_local;
  DdApaNumber first_local;
  int digitsFirst_local;
  
  for (local_30 = 0; (local_30 < digitsFirst && (first[local_30] == 0)); local_30 = local_30 + 1) {
  }
  for (local_34 = 0; (local_34 < digitsSecond && (second[local_34] == 0)); local_34 = local_34 + 1)
  {
  }
  if (digitsSecond - local_34 < digitsFirst - local_30) {
    first_local._4_4_ = 1;
  }
  else if (digitsFirst - local_30 < digitsSecond - local_34) {
    first_local._4_4_ = -1;
  }
  else {
    for (secondNZ = 0; secondNZ < digitsFirst - local_30; secondNZ = secondNZ + 1) {
      if (second[local_34 + secondNZ] < first[local_30 + secondNZ]) {
        return 1;
      }
      if (first[local_30 + secondNZ] < second[local_34 + secondNZ]) {
        return -1;
      }
    }
    first_local._4_4_ = 0;
  }
  return first_local._4_4_;
}

Assistant:

int
Cudd_ApaCompare(
  int digitsFirst,
  DdApaNumber  first,
  int digitsSecond,
  DdApaNumber  second)
{
    int i;
    int firstNZ, secondNZ;

    /* Find first non-zero in both numbers. */
    for (firstNZ = 0; firstNZ < digitsFirst; firstNZ++)
        if (first[firstNZ] != 0) break;
    for (secondNZ = 0; secondNZ < digitsSecond; secondNZ++)
        if (second[secondNZ] != 0) break;
    if (digitsFirst - firstNZ > digitsSecond - secondNZ) return(1);
    else if (digitsFirst - firstNZ < digitsSecond - secondNZ) return(-1);
    for (i = 0; i < digitsFirst - firstNZ; i++) {
        if (first[firstNZ + i] > second[secondNZ + i]) return(1);
        else if (first[firstNZ + i] < second[secondNZ + i]) return(-1);
    }
    return(0);

}